

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
* deqp::gles31::Functional::wrapCoreFunctions
            (vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             *__return_storage_ptr__,
            vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
            *fns)

{
  pointer pFVar1;
  pointer __s;
  pointer pFVar2;
  anon_union_8_2_9b810bd7_for_m_func aVar3;
  char *pcVar4;
  FuncType FVar5;
  undefined4 uVar6;
  ulong uVar7;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  *this;
  pointer pFVar8;
  pointer pFVar9;
  pointer pFVar10;
  long lVar11;
  ulong uVar12;
  pointer pFVar13;
  char **ppcVar14;
  void *__s_00;
  long lVar15;
  ulong __n;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar11 = (long)(fns->
                 super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fns->
                 super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar7 = lVar11 * -0x5555555555555555;
  pFVar1 = (__return_storage_ptr__->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __s = (__return_storage_ptr__->
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
        )._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = (long)__s - (long)pFVar1 >> 5;
  __n = uVar7 - uVar12;
  if (uVar7 < uVar12 || __n == 0) {
    if ((uVar7 < uVar12) && (__s != pFVar1 + lVar11 * 0x2aaaaaaaaaaaaab)) {
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      )._M_impl.super__Vector_impl_data._M_finish = pFVar1 + lVar11 * 0x2aaaaaaaaaaaaab;
    }
  }
  else {
    pFVar2 = (__return_storage_ptr__->
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((ulong)((long)pFVar2 - (long)__s >> 5) < __n) {
      uVar7 = __n;
      this = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
              *)std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ::_M_check_len(__return_storage_ptr__,__n,"vector::_M_default_append");
      pFVar8 = std::
               _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ::_M_allocate(this,uVar7);
      __s_00 = (void *)(((long)__s - (long)pFVar1) + (long)pFVar8);
      memset(__s_00,0,__n * 0x20);
      pFVar9 = pFVar8;
      for (pFVar13 = pFVar1; pFVar13 != __s; pFVar13 = pFVar13 + 1) {
        FVar5 = (pFVar13->function).m_type;
        uVar6 = *(undefined4 *)&(pFVar13->function).field_0x4;
        aVar3 = (pFVar13->function).m_func;
        pcVar4 = pFVar13->desc;
        pFVar9->name = pFVar13->name;
        pFVar9->desc = pcVar4;
        (pFVar9->function).m_type = FVar5;
        *(undefined4 *)&(pFVar9->function).field_0x4 = uVar6;
        (pFVar9->function).m_func = aVar3;
        pFVar9 = pFVar9 + 1;
      }
      if (pFVar1 != (pointer)0x0) {
        operator_delete(pFVar1,(long)pFVar2 - (long)pFVar1);
      }
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      )._M_impl.super__Vector_impl_data._M_start = pFVar8;
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__s_00 + __n * 0x20);
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar8 + (long)this;
    }
    else {
      memset(__s,0,__n * 0x20);
      (__return_storage_ptr__->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      )._M_impl.super__Vector_impl_data._M_finish = __s + __n;
    }
  }
  pFVar10 = (fns->
            super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(fns->
                              super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar10) >> 3) *
          -0x55555555) {
    ppcVar14 = &((__return_storage_ptr__->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                 )._M_impl.super__Vector_impl_data._M_start)->desc;
    lVar11 = 0;
    lVar15 = 0;
    do {
      aVar3 = *(anon_union_8_2_9b810bd7_for_m_func *)((long)&pFVar10->function + lVar11);
      (((FunctionContainer *)(ppcVar14 + -3))->function).m_type = TYPE_CORE;
      *(anon_union_8_2_9b810bd7_for_m_func *)(ppcVar14 + -2) = aVar3;
      pFVar10 = (fns->
                super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppcVar14[-1] = *(char **)((long)&pFVar10->name + lVar11);
      *ppcVar14 = *(char **)((long)&pFVar10->desc + lVar11);
      lVar15 = lVar15 + 1;
      pFVar10 = (fns->
                super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x18;
      ppcVar14 = ppcVar14 + 4;
    } while (lVar15 < (int)((ulong)((long)(fns->
                                          super__Vector_base<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pFVar10) >> 3) * -0x55555555);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<FunctionContainer> wrapCoreFunctions (const vector<NegativeTestShared::FunctionContainer>& fns)
{
	vector<FunctionContainer> retVal;

	retVal.resize(fns.size());
	for (int ndx = 0; ndx < (int)fns.size(); ++ndx)
	{
		retVal[ndx].function = TestFunctionWrapper(fns[ndx].function);
		retVal[ndx].name = fns[ndx].name;
		retVal[ndx].desc = fns[ndx].desc;
	}

	return retVal;
}